

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnElemSegment
          (SharedValidator *this,Location *loc,Var *table_var,SegmentKind kind)

{
  Result RVar1;
  Enum EVar2;
  TableType table_type;
  TableType local_a8;
  ElemType local_88;
  Var local_70;
  
  local_a8.limits.max._0_3_ = 0;
  local_a8.limits._11_8_ = 0;
  local_a8.element.enum_ = Any;
  local_a8.element.type_index_ = 0;
  local_a8.limits.initial._0_3_ = 0;
  local_a8.limits.initial._3_5_ = 0;
  if (kind == Active) {
    Var::Var(&local_70,table_var);
    RVar1 = CheckTableIndex(this,&local_70,&local_a8);
    EVar2 = (Enum)(RVar1.enum_ == Error);
    Var::~Var(&local_70);
  }
  else {
    EVar2 = Ok;
  }
  local_88.is_active = kind == Active;
  local_88.element.enum_ = Void;
  local_88.element.type_index_ = 0;
  local_88.table_type = local_a8.element;
  std::vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>::
  emplace_back<wabt::SharedValidator::ElemType>(&this->elems_,&local_88);
  return (Result)EVar2;
}

Assistant:

Result SharedValidator::OnElemSegment(const Location& loc,
                                      Var table_var,
                                      SegmentKind kind) {
  Result result = Result::Ok;
  TableType table_type;
  if (kind == SegmentKind::Active) {
    result |= CheckTableIndex(table_var, &table_type);
  }
  // Type gets set later in OnElemSegmentElemType.
  elems_.push_back(
      ElemType{Type::Void, kind == SegmentKind::Active, table_type.element});
  return result;
}